

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void xdgDecorationHandleConfigure
               (void *userData,zxdg_toplevel_decoration_v1 *decoration,uint32_t mode)

{
  wl_buffer *pwVar1;
  _GLFWwindow *window;
  uchar auStack_24 [4];
  GLFWimage GStack_20;
  
  *(uint32_t *)((long)userData + 0x3d0) = mode;
  if (mode != 1) {
    *(undefined4 *)((long)userData + 0x460) = 0;
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x470));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x488));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x4a0));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x4b8));
    return;
  }
  if ((*(int *)((long)userData + 0xc) != 0) && (*(long *)((long)userData + 0x50) == 0)) {
    GStack_20.pixels = auStack_24;
    auStack_24[0] = 0xe0;
    auStack_24[1] = 0xe0;
    auStack_24[2] = 0xe0;
    auStack_24[3] = 0xff;
    GStack_20.width = 1;
    GStack_20.height = 1;
    if (_glfw.wl.viewporter != (wp_viewporter *)0x0) {
      if (*(long *)((long)userData + 0x468) == 0) {
        pwVar1 = createShmBuffer(&GStack_20);
        *(wl_buffer **)((long)userData + 0x468) = pwVar1;
      }
      if (*(wl_buffer **)((long)userData + 0x468) != (wl_buffer *)0x0) {
        createFallbackEdge((_GLFWwindow *)userData,
                           (_GLFWfallbackEdgeWayland *)((long)userData + 0x470),
                           *(wl_surface **)((long)userData + 0x388),
                           *(wl_buffer **)((long)userData + 0x468),0,-0x18,
                           *(int *)((long)userData + 0x358),0x18);
        createFallbackEdge((_GLFWwindow *)userData,
                           (_GLFWfallbackEdgeWayland *)((long)userData + 0x488),
                           *(wl_surface **)((long)userData + 0x388),
                           *(wl_buffer **)((long)userData + 0x468),-4,-0x18,4,
                           *(int *)((long)userData + 0x35c) + 0x18);
        createFallbackEdge((_GLFWwindow *)userData,
                           (_GLFWfallbackEdgeWayland *)((long)userData + 0x4a0),
                           *(wl_surface **)((long)userData + 0x388),
                           *(wl_buffer **)((long)userData + 0x468),*(int *)((long)userData + 0x358),
                           -0x18,4,*(int *)((long)userData + 0x35c) + 0x18);
        createFallbackEdge((_GLFWwindow *)userData,
                           (_GLFWfallbackEdgeWayland *)((long)userData + 0x4b8),
                           *(wl_surface **)((long)userData + 0x388),
                           *(wl_buffer **)((long)userData + 0x468),-4,
                           *(int *)((long)userData + 0x35c),*(int *)((long)userData + 0x358) + 8,4);
        *(undefined4 *)((long)userData + 0x460) = 1;
      }
    }
    return;
  }
  return;
}

Assistant:

static void xdgDecorationHandleConfigure(void* userData,
                                         struct zxdg_toplevel_decoration_v1* decoration,
                                         uint32_t mode)
{
    _GLFWwindow* window = userData;

    window->wl.xdg.decorationMode = mode;

    if (mode == ZXDG_TOPLEVEL_DECORATION_V1_MODE_CLIENT_SIDE)
    {
        if (window->decorated && !window->monitor)
            createFallbackDecorations(window);
    }
    else
        destroyFallbackDecorations(window);
}